

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_floor.cpp
# Opt level: O1

bool EV_DoChange(line_t_conflict *line,EChange changetype,int tag)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  sector_t_conflict *model;
  sector_t_conflict *this;
  FSectorTagIterator it;
  FSectorTagIterator local_38;
  
  if (tag == 0) {
    local_38.start = 0;
  }
  else {
    local_38.start = tagManager.TagHashFirst[tag & 0xff];
  }
  local_38.searchtag = tag;
  uVar3 = FSectorTagIterator::Next(&local_38);
  if (-1 < (int)uVar3) {
    uVar4 = uVar3;
    do {
      this = sectors + uVar4;
      if (changetype == numChangeOnly) {
        model = sector_t::FindModelFloorSector
                          (this,((this->floorplane).normal.Y * (this->centerspot).Y +
                                (this->floorplane).normal.X * (this->centerspot).X +
                                (this->floorplane).D) * (this->floorplane).negiC);
        if (model != (sector_t_conflict *)0x0) {
          iVar1 = model->planes[0].Texture.texnum;
          iVar2 = this->planes[0].Texture.texnum;
          this->planes[0].Texture.texnum = iVar1;
          if (iVar2 != iVar1) {
            sector_t::AdjustFloorClip((sector_t *)this);
          }
          goto LAB_003f7c52;
        }
      }
      else if ((changetype == trigChangeOnly) && (line != (line_t_conflict *)0x0)) {
        iVar1 = line->frontsector->planes[0].Texture.texnum;
        iVar2 = this->planes[0].Texture.texnum;
        this->planes[0].Texture.texnum = iVar1;
        if (iVar2 != iVar1) {
          sector_t::AdjustFloorClip((sector_t *)this);
        }
        model = line->frontsector;
LAB_003f7c52:
        sector_t::TransferSpecial(this,model);
      }
      uVar4 = FSectorTagIterator::Next(&local_38);
    } while (-1 < (int)uVar4);
  }
  return -1 < (int)uVar3;
}

Assistant:

bool EV_DoChange (line_t *line, EChange changetype, int tag)
{
	int			secnum;
	bool		rtn;
	sector_t	*sec;
	sector_t	*secm;

	rtn = false;
	// change all sectors with the same tag as the linedef
	FSectorTagIterator it(tag);
	while ((secnum = it.Next()) >= 0)
	{
		sec = &sectors[secnum];
              
		rtn = true;

		// handle trigger or numeric change type
		FTextureID oldpic = sec->GetTexture(sector_t::floor);

		switch(changetype)
		{
		case trigChangeOnly:
			if (line)
			{ // [RH] if no line, no change
				sec->SetTexture(sector_t::floor, line->frontsector->GetTexture(sector_t::floor));
				sec->TransferSpecial(line->frontsector);
			}
			break;
		case numChangeOnly:
			secm = sec->FindModelFloorSector (sec->CenterFloor());
			if (secm)
			{ // if no model, no change
				sec->SetTexture(sector_t::floor, secm->GetTexture(sector_t::floor));
				sec->TransferSpecial(secm);
			}
			break;
		default:
			break;
		}
	}
	return rtn;
}